

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_functs.hpp
# Opt level: O1

bool Limonp::utf8ToUnicode
               (char *str,uint len,vector<unsigned_short,_std::allocator<unsigned_short>_> *vec)

{
  byte bVar1;
  pointer puVar2;
  iterator iVar3;
  ushort uVar4;
  int iVar5;
  ulong in_RAX;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  bool bVar9;
  undefined8 uStack_38;
  
  if (str == (char *)0x0) {
    bVar9 = false;
  }
  else {
    puVar2 = (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar2) {
      (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar2;
    }
    bVar9 = len == 0;
    if (!bVar9) {
      uVar8 = 0;
      uStack_38 = in_RAX;
      do {
        iVar6 = (int)uVar8;
        bVar1 = str[uVar8];
        if ((char)bVar1 < '\0') {
          if ((bVar1 < 0xe0) && (iVar6 + 1U < len)) {
            uVar4 = (bVar1 & 0x1c) << 6 | (ushort)(byte)(bVar1 << 6) | (byte)str[iVar6 + 1U] & 0x3f;
            uStack_38._0_6_ = CONCAT24(uVar4,(undefined4)uStack_38);
            iVar3._M_current =
                 (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(vec,iVar3,(unsigned_short *)((long)&uStack_38 + 4));
            }
            else {
              *iVar3._M_current = uVar4;
              (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            iVar5 = 2;
          }
          else {
            if (0xef < bVar1) {
              return bVar9;
            }
            if (len <= iVar6 + 2U) {
              return bVar9;
            }
            uVar4 = (ushort)(byte)((byte)str[iVar6 + 1] >> 2 & 0xf | bVar1 << 4) << 8 |
                    (ushort)(byte)(str[iVar6 + 1] << 6) | (byte)str[iVar6 + 2U] & 0x3f;
            uStack_38._0_4_ = CONCAT22(uVar4,(undefined2)uStack_38);
            iVar3._M_current =
                 (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
              _M_realloc_insert<unsigned_short>(vec,iVar3,(unsigned_short *)((long)&uStack_38 + 2));
            }
            else {
              *iVar3._M_current = uVar4;
              (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar3._M_current + 1;
            }
            iVar5 = 3;
          }
        }
        else {
          uStack_38 = (ulong)CONCAT16(bVar1,(undefined6)uStack_38);
          iVar3._M_current =
               (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
            _M_realloc_insert<unsigned_short>(vec,iVar3,(unsigned_short *)((long)&uStack_38 + 6));
          }
          else {
            *iVar3._M_current = (ushort)bVar1;
            (vec->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          iVar5 = 1;
        }
        uVar7 = iVar6 + iVar5;
        uVar8 = (ulong)uVar7;
        bVar9 = uVar7 >= len;
      } while (uVar7 < len);
    }
  }
  return bVar9;
}

Assistant:

inline bool utf8ToUnicode(const char * const str, uint len, vector<uint16_t>& vec)
    {
        char ch1, ch2;
        if(!str)
        {
            return false;
        }
        vec.clear();
        for(uint i = 0;i < len;)
        {
            if(!(str[i] & 0x80)) // 0xxxxxxx
            {
                vec.push_back(str[i]);
                i++;
            }
            else if ((unsigned char)str[i] <= 0xdf && i + 1 < len) // 110xxxxxx
            {
                ch1 = (str[i] >> 2) & 0x07;
                ch2 = (str[i+1] & 0x3f) | ((str[i] & 0x03) << 6 );
                vec.push_back(twocharToUint16(ch1, ch2));
                i += 2;
            }
            else if((unsigned char)str[i] <= 0xef && i + 2 < len)
            {
                ch1 = (str[i] << 4) | ((str[i+1] >> 2) & 0x0f );
                ch2 = ((str[i+1]<<6) & 0xc0) | (str[i+2] & 0x3f); 
                vec.push_back(twocharToUint16(ch1, ch2));
                i += 3;
            }
            else
            {
                return false;
            }
        }
        return true;
    }